

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
* __thiscall
MutableS2ShapeIndex::ReleaseAll
          (vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           *__return_storage_ptr__,MutableS2ShapeIndex *this)

{
  atomic<const_S2ShapeIndexCell_*> aVar1;
  S2LogMessage local_70;
  Iterator it;
  
  it.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  it.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  it.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_00304188;
  it.index_ = (MutableS2ShapeIndex *)0x0;
  it.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  it.iter_.position = -1;
  it.end_.node = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  *)0x0;
  it.end_.position = -1;
  Iterator::InitStale(&it,this,BEGIN);
  while (aVar1._M_b._M_p = it.super_IteratorBase.cell_._M_b._M_p,
        it.super_IteratorBase.id_.id_ != 0xffffffffffffffff) {
    S2ShapeIndexCell::~S2ShapeIndexCell((S2ShapeIndexCell *)it.super_IteratorBase.cell_._M_b._M_p);
    operator_delete((void *)aVar1._M_b._M_p);
    Iterator::Next(&it);
  }
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  ::clear((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           *)&this->cell_map_);
  this->pending_additions_begin_ = 0;
  std::
  __uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           *)&this->pending_removals_,(pointer)0x0);
  if ((this->update_state_)._M_t.
      super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
      ._M_t.
      super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
      .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl ==
      (UpdateState *)0x0) {
    (this->index_status_)._M_i = FRESH;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    ::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)__return_storage_ptr__,(_Vector_impl_data *)&this->shapes_);
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
             ,0xe0,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_70.stream_,"Check failed: update_state_ == nullptr ");
  abort();
}

Assistant:

vector<unique_ptr<S2Shape>> MutableS2ShapeIndex::ReleaseAll() {
  Iterator it;
  for (it.InitStale(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    delete &it.cell();
  }
  cell_map_.clear();
  pending_additions_begin_ = 0;
  pending_removals_.reset();
  S2_DCHECK(update_state_ == nullptr);
  index_status_.store(FRESH, std::memory_order_relaxed);
  vector<unique_ptr<S2Shape>> result;
  result.swap(shapes_);
  return result;
}